

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_read.cpp
# Opt level: O3

bool __thiscall
ritobin::io::impl_binary_read::BinBinaryReader::read_value_visit<ritobin::U8>
          (BinBinaryReader *this,U8 *value)

{
  char **ppcVar1;
  byte *pos;
  byte *pbVar2;
  byte bVar3;
  
  pos = (byte *)(this->reader).cur_;
  pbVar2 = (byte *)(this->reader).cap_;
  if (pbVar2 < pos + 1) {
    bVar3 = fail_msg(this,"reader.read(value.value)",(char *)pos);
  }
  else {
    bVar3 = *pos;
    value->value = bVar3;
    ppcVar1 = &(this->reader).cur_;
    *ppcVar1 = *ppcVar1 + 1;
  }
  return (bool)(pos + 1 <= pbVar2 | bVar3 & 1);
}

Assistant:

inline bool read(T& value) noexcept {
            static_assert(std::is_arithmetic_v<T>);
            if (cur_ + sizeof(T) > cap_) {
                return false;
            }
            memcpy(&value, cur_, sizeof(T));
            cur_ += sizeof(T);
            return true;
        }